

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Entry * __thiscall
kj::Vector<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>::
add<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>
          (Vector<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry> *this,Entry *params)

{
  Entry *pEVar1;
  RawSchema *pRVar2;
  unsigned_long *puVar3;
  
  puVar3 = *(unsigned_long **)(this + 8);
  if (puVar3 == *(unsigned_long **)(this + 0x10)) {
    Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::grow
              ((Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)this,0);
    puVar3 = *(unsigned_long **)(this + 8);
  }
  pRVar2 = params->value;
  *puVar3 = params->key;
  puVar3[1] = (unsigned_long)pRVar2;
  pEVar1 = *(Entry **)(this + 8);
  *(Entry **)(this + 8) = pEVar1 + 1;
  return pEVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }